

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_intrapred_sse2.c
# Opt level: O3

void aom_highbd_h_predictor_32x32_sse2
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  long lVar2;
  undefined4 uVar4;
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  
  lVar2 = 0;
  do {
    auVar3 = *(undefined1 (*) [16])((long)left + lVar2);
    auVar5 = pshuflw(in_XMM1,auVar3,0);
    auVar5._4_4_ = auVar5._0_4_;
    auVar5._8_4_ = auVar5._0_4_;
    auVar5._12_4_ = auVar5._0_4_;
    *(undefined1 (*) [16])dst = auVar5;
    *(undefined1 (*) [16])((long)dst + 0x10) = auVar5;
    *(undefined1 (*) [16])((long)dst + 0x20) = auVar5;
    *(undefined1 (*) [16])((long)dst + 0x30) = auVar5;
    auVar5 = pshuflw(auVar5,auVar3,0x55);
    auVar6._0_4_ = auVar5._0_4_;
    auVar6._4_4_ = auVar6._0_4_;
    auVar6._8_4_ = auVar6._0_4_;
    auVar6._12_4_ = auVar6._0_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 2) = auVar6;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 2) = auVar6;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 2) = auVar6;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 2) = auVar6;
    auVar5 = pshuflw(auVar6,auVar3,0xaa);
    auVar7._0_4_ = auVar5._0_4_;
    auVar7._4_4_ = auVar7._0_4_;
    auVar7._8_4_ = auVar7._0_4_;
    auVar7._12_4_ = auVar7._0_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 2 * 2) = auVar7;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 2 * 2) = auVar7
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 2 * 2) = auVar7
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 2 * 2) = auVar7
    ;
    auVar5 = pshuflw(auVar7,auVar3,0xff);
    auVar8._0_4_ = auVar5._0_4_;
    auVar8._4_4_ = auVar8._0_4_;
    auVar8._8_4_ = auVar8._0_4_;
    auVar8._12_4_ = auVar8._0_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 3 * 2) = auVar8;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 3 * 2) = auVar8
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 3 * 2) = auVar8
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 3 * 2) = auVar8
    ;
    auVar5 = pshufhw(auVar8,auVar3,0);
    auVar9._8_4_ = auVar5._8_4_;
    auVar9._4_4_ = auVar9._8_4_;
    auVar9._0_4_ = auVar9._8_4_;
    auVar9._12_4_ = auVar9._8_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 4 * 2) = auVar9;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 4 * 2) = auVar9
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 4 * 2) = auVar9
    ;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 4 * 2) = auVar9
    ;
    auVar5 = pshufhw(auVar9,auVar3,0x55);
    auVar10._8_4_ = auVar5._8_4_;
    auVar10._4_4_ = auVar10._8_4_;
    auVar10._0_4_ = auVar10._8_4_;
    auVar10._12_4_ = auVar10._8_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 5 * 2) = auVar10;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 5 * 2) =
         auVar10;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 5 * 2) =
         auVar10;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 5 * 2) =
         auVar10;
    auVar5 = pshufhw(auVar10,auVar3,0xaa);
    in_XMM1._8_4_ = auVar5._8_4_;
    in_XMM1._4_4_ = in_XMM1._8_4_;
    in_XMM1._0_4_ = in_XMM1._8_4_;
    in_XMM1._12_4_ = in_XMM1._8_4_;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])dst + stride * 6 * 2) = in_XMM1;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 6 * 2) =
         in_XMM1;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 6 * 2) =
         in_XMM1;
    *(undefined1 (*) [16])((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 6 * 2) =
         in_XMM1;
    auVar3 = pshufhw(auVar3,auVar3,0xff);
    uVar4 = auVar3._8_4_;
    puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])dst + stride * 7 * 2);
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])((long)dst + 0x10) + stride * 7 * 2);
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])((long)dst + 0x20) + stride * 7 * 2);
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    puVar1 = (uint16_t *)((long)*(undefined1 (*) [16])((long)dst + 0x30) + stride * 7 * 2);
    *(undefined4 *)puVar1 = uVar4;
    *(undefined4 *)(puVar1 + 2) = uVar4;
    *(undefined4 *)(puVar1 + 4) = uVar4;
    *(undefined4 *)(puVar1 + 6) = uVar4;
    lVar2 = lVar2 + 0x10;
    dst = (uint16_t *)((long)dst + stride * 0x10);
  } while ((int)lVar2 != 0x40);
  return;
}

Assistant:

void aom_highbd_h_predictor_32x32_sse2(uint16_t *dst, ptrdiff_t stride,
                                       const uint16_t *above,
                                       const uint16_t *left, int bd) {
  int i;
  (void)above;
  (void)bd;

  for (i = 0; i < 4; i++, left += 8) {
    h_predictor_32x8(dst, stride, left);
    dst += stride << 3;
  }
}